

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O3

Bool prvTidytidySetLanguage(ctmbstr languageCode)

{
  ulong in_RAX;
  languageDefinition *plVar1;
  size_t sVar2;
  languageDefinition *plVar3;
  bool bVar4;
  bool bVar5;
  undefined8 uStack_18;
  bool bVar6;
  
  if (languageCode == (ctmbstr)0x0) {
    return no;
  }
  uStack_18 = in_RAX;
  prvTidytidyNormalizedLocaleName(languageCode);
  plVar1 = prvTidytidyTestLanguage(prvTidytidyNormalizedLocaleName::result);
  sVar2 = strlen(prvTidytidyNormalizedLocaleName::result);
  if (sVar2 < 3) {
    bVar4 = false;
    plVar3 = (languageDefinition *)0x0;
LAB_00137bf0:
    bVar6 = plVar1 != (languageDefinition *)0x0;
    bVar5 = plVar1 == (languageDefinition *)0x0;
    if (bVar5 || bVar4 != false) goto LAB_00137c02;
  }
  else {
    strncpy((char *)((long)&uStack_18 + 5),prvTidytidyNormalizedLocaleName::result,2);
    uStack_18 = uStack_18 & 0xffffffffffffff;
    plVar3 = prvTidytidyTestLanguage((char *)((long)&uStack_18 + 5));
    bVar4 = plVar3 != (languageDefinition *)0x0;
    if (plVar1 == (languageDefinition *)0x0 || !bVar4) goto LAB_00137bf0;
    bVar6 = true;
    bVar5 = false;
    bVar4 = true;
    tidyLanguages.currentLanguage = plVar1;
    tidyLanguages.fallbackLanguage = plVar3;
LAB_00137c02:
    plVar1 = plVar3;
    if (!(bool)(bVar5 & bVar4)) goto LAB_00137c20;
  }
  tidyLanguages.fallbackLanguage = (languageDefinition *)0x0;
  tidyLanguages.currentLanguage = plVar1;
LAB_00137c20:
  return (uint)(byte)(bVar6 | bVar4);
}

Assistant:

Bool TY_(tidySetLanguage)( ctmbstr languageCode )
{
    languageDefinition *dict1 = NULL;
    languageDefinition *dict2 = NULL;
    tmbstr wantCode = NULL;
    char lang[3] = "";
    
    if ( !languageCode || !(wantCode = TY_(tidyNormalizedLocaleName)( languageCode )) )
    {
        return no;
    }
    
    /* We want to use the specified language as the currentLanguage, and set
     fallback language as necessary. We have either a two or five digit code,
     either or both of which might be installed. Let's test both of them:
     */
    
    dict1 = TY_(tidyTestLanguage( wantCode ));  /* WANTED language */
    
    if ( strlen( wantCode ) > 2 )
    {
        strncpy(lang, wantCode, 2);
        lang[2] = '\0';
        dict2 = TY_(tidyTestLanguage( lang ) ); /* BACKUP language? */
    }
    
    if ( dict1 && dict2 )
    {
        tidyLanguages.currentLanguage = dict1;
        tidyLanguages.fallbackLanguage = dict2;
    }
    if ( dict1 && !dict2 )
    {
        tidyLanguages.currentLanguage = dict1;
        tidyLanguages.fallbackLanguage = NULL;
    }
    if ( !dict1 && dict2 )
    {
        tidyLanguages.currentLanguage = dict2;
        tidyLanguages.fallbackLanguage = NULL;
    }
    if ( !dict1 && !dict2 )
    {
        /* No change. */
    }
    
    return dict1 || dict2;
}